

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

void __thiscall leveldb::MemTableIterator::Next(MemTableIterator *this)

{
  long lVar1;
  long in_FS_OFFSET;
  Iterator *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Next
            (in_stack_ffffffffffffffe8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Next() override { iter_.Next(); }